

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void gimage::anon_unknown_6::saveInternal<float>
               (Image<float,_gimage::PixelTraits<float>_> *image,char *name)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  allocator_type *paVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  float *pfVar11;
  string *message;
  IOException *this;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  store_t_conflict sVar13;
  int d;
  long i;
  float *p;
  long k_1;
  vector<float,_std::allocator<float>_> line;
  long k;
  int strip;
  TIFF *tif;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  allocator *__lhs;
  allocator_type *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  string *in_stack_fffffffffffffe28;
  IOException *in_stack_fffffffffffffe30;
  allocator local_151;
  string local_150 [68];
  int local_10c;
  long local_108;
  float *local_100;
  ulong local_f8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [64];
  ulong local_88;
  int local_7c [3];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [64];
  allocator_type *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  Image<float,_gimage::PixelTraits<float>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  paVar6 = (allocator_type *)TIFFOpen(in_RSI,"w");
  local_18 = paVar6;
  if (paVar6 == (allocator_type *)0x0) {
    local_6d = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)local_10,&local_59);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    gutil::IOException::IOException(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_6d = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  uVar8 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
  TIFFSetField(paVar6,0x100,uVar8 & 0xffffffff);
  paVar6 = local_18;
  uVar8 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
  TIFFSetField(paVar6,0x101,uVar8 & 0xffffffff);
  paVar6 = local_18;
  uVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
  TIFFSetField(paVar6,0x115,uVar2 & 0xffff);
  TIFFSetField(local_18,0x102,0x20);
  TIFFSetField(local_18,0x153,3);
  lVar9 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
  iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar9 * iVar3 * 4;
  local_7c[2] = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x2000)) / auVar1,0);
  local_7c[1] = 1;
  piVar10 = std::max<int>(local_7c + 1,local_7c + 2);
  local_7c[2] = *piVar10;
  lVar9 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
  local_7c[0] = (int)lVar9;
  piVar10 = std::min<int>(local_7c,local_7c + 2);
  paVar6 = local_18;
  local_7c[2] = *piVar10;
  uVar4 = TIFFDefaultStripSize(local_18,local_7c[2]);
  TIFFSetField(paVar6,0x116,uVar4);
  TIFFSetField(local_18,0x112,1);
  TIFFSetField(local_18,0x11c,1);
  iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
  if ((iVar3 == 3) ||
     (iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8), iVar3 == 4)) {
    TIFFSetField(local_18,0x106,2);
  }
  else {
    TIFFSetField(local_18,0x106,1);
  }
  iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
  if (iVar3 == 1) {
    for (local_88 = 0; uVar8 = local_88,
        lVar9 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8), paVar6 = local_18,
        (long)uVar8 < lVar9; local_88 = local_88 + 1) {
      pfVar11 = Image<float,_gimage::PixelTraits<float>_>::getPtr(local_8,0,local_88,0);
      iVar3 = TIFFWriteScanline(paVar6,pfVar11,local_88 & 0xffffffff,0);
      if (iVar3 < 0) {
        TIFFClose(local_18);
        local_ca = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,(char *)local_10,&local_c9);
        std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        gutil::IOException::IOException(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        local_ca = 0;
        __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
      }
    }
  }
  else {
    message = (string *)Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
    iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
    this = (IOException *)((long)message * (long)iVar3);
    std::allocator<float>::allocator((allocator<float> *)0x1a22c2);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe00);
    std::allocator<float>::~allocator((allocator<float> *)0x1a22e8);
    for (local_f8 = 0; uVar8 = local_f8,
        lVar9 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8), (long)uVar8 < lVar9;
        local_f8 = local_f8 + 1) {
      local_100 = std::vector<float,_std::allocator<float>_>::data
                            ((vector<float,_std::allocator<float>_> *)0x1a232c);
      for (local_108 = 0; lVar9 = local_108,
          lVar12 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8), lVar9 < lVar12;
          local_108 = local_108 + 1) {
        local_10c = 0;
        while (iVar3 = local_10c,
              iVar5 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8), iVar3 < iVar5) {
          sVar13 = Image<float,_gimage::PixelTraits<float>_>::get
                             (local_8,local_108,local_f8,local_10c);
          *local_100 = sVar13;
          local_10c = local_10c + 1;
          local_100 = local_100 + 1;
        }
      }
      in_stack_fffffffffffffe00 = local_18;
      pfVar11 = std::vector<float,_std::allocator<float>_>::data
                          ((vector<float,_std::allocator<float>_> *)0x1a2473);
      iVar3 = TIFFWriteScanline(in_stack_fffffffffffffe00,pfVar11,local_f8 & 0xffffffff,0);
      if (iVar3 < 0) {
        TIFFClose(local_18);
        uVar7 = __cxa_allocate_exception(0x28);
        __lhs = &local_151;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,(char *)local_10,__lhs);
        std::operator+((char *)__lhs,local_10);
        gutil::IOException::IOException(this,message);
        __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe00);
  }
  TIFFClose(local_18);
  return;
}

Assistant:

void saveInternal(const Image<T> &image, const char *name)
{
  TIFF* tif=TIFFOpen(name, "w");

  if (!tif)
  {
    throw gutil::IOException("Cannot store image: "+std::string(name));
  }

  TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, static_cast<uint32_t>(image.getWidth()));
  TIFFSetField(tif, TIFFTAG_IMAGELENGTH, static_cast<uint32_t>(image.getHeight()));
  TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, static_cast<uint16_t>(image.getDepth()));
  TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 8*sizeof(T));

  if (std::is_floating_point<T>::value)
  {
    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_IEEEFP);
  }
  else
  {
    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
  }

  int strip=static_cast<int>(8192/(image.getWidth()*image.getDepth()*sizeof(T)));
  strip=std::max(1, strip);
  strip=std::min(static_cast<int>(image.getHeight()), strip);

  TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, TIFFDefaultStripSize(tif, static_cast<uint32_t>(strip)));

  TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
  TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);

  if (image.getDepth() == 3 || image.getDepth() == 4)
  {
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, PHOTOMETRIC_RGB);
  }
  else
  {
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, PHOTOMETRIC_MINISBLACK);
  }

  if (image.getDepth() == 1)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      if (TIFFWriteScanline(tif, image.getPtr(0, k, 0), static_cast<uint32_t>(k), 0) < 0)
      {
        TIFFClose(tif);
        throw gutil::IOException("Cannot write image data: "+std::string(name));
      }
    }
  }
  else
  {
    std::vector<T> line(image.getWidth()*image.getDepth());

    for (long k=0; k<image.getHeight(); k++)
    {
      T *p=line.data();
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int d=0; d<image.getDepth(); d++)
        {
          *p++=image.get(i, k, d);
        }
      }

      if (TIFFWriteScanline(tif, line.data(), static_cast<uint32_t>(k), 0) < 0)
      {
        TIFFClose(tif);
        throw gutil::IOException("Cannot write image data: "+std::string(name));
      }
    }
  }

  TIFFClose(tif);
}